

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O0

float __thiscall
draco::DracoOptions<int>::GetAttributeFloat
          (DracoOptions<int> *this,AttributeKey *att_key,string *name,float default_val)

{
  bool bVar1;
  Options *this_00;
  string *in_RDX;
  DracoOptions<int> *in_RSI;
  string *in_RDI;
  float in_XMM0_Da;
  Options *att_options;
  float local_4;
  
  this_00 = FindAttributeOptions(in_RSI,(int *)in_RDX);
  if ((this_00 == (Options *)0x0) || (bVar1 = Options::IsOptionSet(this_00,in_RDI), !bVar1)) {
    local_4 = Options::GetFloat(&in_RSI->global_options_,in_RDX,in_XMM0_Da);
  }
  else {
    local_4 = Options::GetFloat(&in_RSI->global_options_,in_RDX,in_XMM0_Da);
  }
  return local_4;
}

Assistant:

float DracoOptions<AttributeKeyT>::GetAttributeFloat(
    const AttributeKeyT &att_key, const std::string &name,
    float default_val) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options && att_options->IsOptionSet(name)) {
    return att_options->GetFloat(name, default_val);
  }
  return global_options_.GetFloat(name, default_val);
}